

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O1

void __thiscall
rest_rpc::rpc_service::connection::on_write(connection *this,error_code ec,size_t length)

{
  _Any_data *p_Var1;
  undefined8 uVar2;
  error_category *peVar3;
  void *__buf;
  int __fd;
  __shared_ptr<rest_rpc::rpc_service::connection,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  peVar3 = ec._M_cat;
  __fd = ec._M_value;
  if (__fd == 0) {
    if (this->has_closed_ == false) {
      std::deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>::pop_front
                (&this->write_queue_);
      if ((this->write_queue_).
          super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>._M_impl
          .super__Deque_impl_data._M_finish._M_cur !=
          (this->write_queue_).
          super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>._M_impl
          .super__Deque_impl_data._M_start._M_cur) {
        write(this,__fd,__buf,length);
        return;
      }
    }
  }
  else {
    (**(code **)(*(long *)peVar3 + 0x20))(local_40,peVar3,ec._0_8_ & 0xffffffff);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    p_Var1 = (_Any_data *)this->on_net_err_;
    if (p_Var1 != (_Any_data *)0x0) {
      std::__shared_ptr<rest_rpc::rpc_service::connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<rest_rpc::rpc_service::connection,void>
                (local_70,(__weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>
                           *)this);
      (**(code **)(*(long *)peVar3 + 0x20))(&local_60,peVar3,ec._0_8_ & 0xffffffff);
      if (*(long *)(p_Var1 + 1) == 0) {
        uVar2 = std::__throw_bad_function_call();
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
        _Unwind_Resume(uVar2);
      }
      (**(code **)(p_Var1->_M_pod_data + 0x18))
                (p_Var1,(shared_ptr<rest_rpc::rpc_service::connection> *)local_70,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
      }
    }
    close(this,0);
  }
  return;
}

Assistant:

void on_write(asio::error_code ec, std::size_t length) {
    if (ec) {
      print(ec);
      if (on_net_err_) {
        (*on_net_err_)(shared_from_this(), ec.message());
      }
      close(false);
      return;
    }

    if (has_closed()) {
      return;
    }

    write_queue_.pop_front();

    if (!write_queue_.empty()) {
      write();
    }
  }